

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

ssize_t __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::read
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  unsigned_short *puVar1;
  undefined8 extraout_RAX;
  
  puVar1 = this->P;
  if (((puVar1 != (unsigned_short *)0x0) &&
      ((uint)((ulong)((long)puVar1 - (long)this->TextBegin) >> 1) < this->TextSize - 1)) &&
     (*puVar1 != 0)) {
    parseCurrentNode(this);
    return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  return 0;
}

Assistant:

virtual bool read()
	{
		// if not end reached, parse the node
		if (P && (unsigned int)(P - TextBegin) < TextSize - 1 && *P != 0)
		{
			parseCurrentNode();
			return true;
		}

		_IRR_IMPLEMENT_MANAGED_MARSHALLING_BUGFIX;
		return false;
	}